

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_Plane * __thiscall
ON_SubDMeshFragment::CornerFrame
          (ON_Plane *__return_storage_ptr__,ON_SubDMeshFragment *this,uint grid_corner_index)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  uint S_dex;
  uint grid_corner_index_local;
  ON_SubDMeshFragment *this_local;
  ON_Plane *corner_frame;
  
  if (((grid_corner_index < 4) && ((this->m_grid).m_side_segment_count != '\0')) &&
     ((this->m_grid).m_S != (uint *)0x0)) {
    uVar3 = grid_corner_index * (this->m_grid).m_side_segment_count;
    ON_Plane::ON_Plane(__return_storage_ptr__);
    puVar1 = (this->m_grid).m_S;
    bVar2 = Internal_GetFrameHelper(this,puVar1[uVar3],puVar1[uVar3 + 1],__return_storage_ptr__);
    if (bVar2) {
      return __return_storage_ptr__;
    }
    ON_Plane::~ON_Plane(__return_storage_ptr__);
  }
  memcpy(__return_storage_ptr__,&ON_Plane::NanPlane,0x80);
  return __return_storage_ptr__;
}

Assistant:

const ON_Plane ON_SubDMeshFragment::CornerFrame(
  unsigned int grid_corner_index
) const
{
  if (grid_corner_index < 4 && m_grid.m_side_segment_count > 0 && nullptr != m_grid.m_S)
  {
    unsigned int S_dex = grid_corner_index * m_grid.m_side_segment_count;
    ON_Plane corner_frame;
    if (Internal_GetFrameHelper(m_grid.m_S[S_dex], m_grid.m_S[S_dex + 1], corner_frame))
      return corner_frame;
  }

  return ON_Plane::NanPlane;
}